

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3stm.cpp
# Opt level: O0

void __thiscall
CTPNStmFinally::gen_code_finally
          (CTPNStmFinally *this,ulong start_prot_ofs,ulong end_prot_ofs,CTPNStmTry *try_stm)

{
  CTPNStmEnclosing *stm;
  CTcT3ExcTable *pCVar1;
  CTPNStmTry *in_RCX;
  ulong in_RDX;
  CTcDataStream *in_RSI;
  CTPNStmEnclosing *in_RDI;
  CTPNStmEnclosing *old_enclosing;
  uchar in_stack_000000af;
  CTcGenTarg *in_stack_000000b0;
  uint val;
  
  CTPNStmBase::add_debug_line_rec((CTPNStmBase *)in_RDI);
  stm = CTcCodeStream::set_enclosing(G_cs,in_RDI);
  pCVar1 = CTcGenTarg::get_exc_table(G_cg);
  val = (uint)((ulong)pCVar1 >> 0x20);
  CTcDataStream::get_ofs(&G_cs->super_CTcDataStream);
  CTcT3ExcTable::add_catch((CTcT3ExcTable *)in_RCX,(ulong)stm,(ulong)in_RDI,in_RDX,(ulong)in_RSI);
  CTcGenTarg::clear_peephole(G_cg);
  CTcGenTarg::note_push((CTcGenTarg *)0x2df4ae);
  CTcSymLocal::s_gen_code_setlcl_stk(0,0x2df4bd);
  CTPNStmTry::gen_jsr_finally((CTPNStmTry *)in_RSI);
  CTcSymLocal::s_gen_code_getlcl(0,0x2df4d6);
  CTcGenTarg::write_op(in_stack_000000b0,in_stack_000000af);
  CTcGenTarg::note_pop((CTcGenTarg *)0x2df4f9);
  CTPNStmBase::add_debug_line_rec((CTPNStmBase *)in_RDI);
  CTPNStmTry::get_finally_lbl(in_RCX);
  CTcPrsNode::def_label_pos((CTcCodeLabel *)in_RDI);
  CTcGenTarg::note_push((CTcGenTarg *)0x2df524);
  CTcSymLocal::s_gen_code_setlcl_stk(0,0x2df533);
  if (in_RDI[1].super_CTPNStm.super_CTPNStmBase.super_CTcPrsNode.super_CTcPrsNodeBase.
      _vptr_CTcPrsNodeBase != (_func_int **)0x0) {
    CTPNStmBase::gen_code_substm((CTPNStmBase *)in_RCX,&stm->super_CTPNStm);
  }
  CTcGenTarg::write_op(in_stack_000000b0,in_stack_000000af);
  CTcDataStream::write2(in_RSI,val);
  CTcCodeStream::set_enclosing(G_cs,stm);
  return;
}

Assistant:

void CTPNStmFinally::gen_code_finally(ulong start_prot_ofs,
                                      ulong end_prot_ofs,
                                      CTPNStmTry *try_stm)
{
    CTPNStmEnclosing *old_enclosing;

    /* 
     *   set the source location for our prolog code to the 'finally'
     *   clause's start 
     */
    add_debug_line_rec();

    /* push the enclosing statement */
    old_enclosing = G_cs->set_enclosing(this);

    /* 
     *   add our exception table entry - use the invalid object ID as a
     *   special flag to indicate that we catch all exceptions 
     */
    G_cg->get_exc_table()->add_catch(start_prot_ofs, end_prot_ofs,
                                     VM_INVALID_OBJ, G_cs->get_ofs());

    /* don't allow any peephole optimizations to affect this offset */
    G_cg->clear_peephole();

    /* the VM pushes the exception onto the stack before calling us */
    G_cg->note_push();

    /*
     *   When we get called due to an exception, we want to run the
     *   'finally' code block and then re-throw the exception.  First, store
     *   the exception parameter in our special local stack slot that we
     *   allocated specifically for the purpose of being a temporary holder
     *   for this value.  
     */
    CTcSymLocal::s_gen_code_setlcl_stk(exc_local_id_, FALSE);

    /* call the 'finally' block */
    try_stm->gen_jsr_finally();

    /*
     *   After the 'finally' block returns, we must re-throw the
     *   exception.  Retrieve the contents of our local where we stashed
     *   the exception object and re-throw the exception.  
     */
    CTcSymLocal::s_gen_code_getlcl(exc_local_id_, FALSE);

    /* re-throw the exception - this pops the exception object */
    G_cg->write_op(OPC_THROW);
    G_cg->note_pop();

    /* 
     *   set the source location to the 'finally' clause once again, since
     *   we changed the source location in the course of generating the
     *   catch-all handler 
     */
    add_debug_line_rec();

    /* this is where the 'finally' code block begins - define our label */
    def_label_pos(try_stm->get_finally_lbl());

    /*
     *   The 'finally' block is the target of LJSR instructions, since we
     *   must run the 'finally' block's code from numerous code paths.
     *   The first thing we must do is pop the return address and stash it
     *   in a local variable.  (We note an extra push, since the LJSR will
     *   have pushed the value before transferring control here.)
     */
    G_cg->note_push();
    CTcSymLocal::s_gen_code_setlcl_stk(jsr_local_id_, FALSE);
    
    /* generate the code block, if there is one */
    if (body_ != 0)
        gen_code_substm(body_);

    /* return from the 'finally' subroutine */
    G_cg->write_op(OPC_LRET);
    G_cs->write2(jsr_local_id_);

    /* restore the enclosing statement */
    G_cs->set_enclosing(old_enclosing);
}